

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.C
# Opt level: O3

bool anon_unknown.dwarf_3488::verifyGrammar(char *v)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = strcmp(v,"ECMAScript");
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = strcmp(v,"basic");
    if (iVar1 != 0) {
      iVar1 = strcmp(v,"extended");
      if (iVar1 != 0) {
        iVar1 = strcmp(v,"awk");
        if (iVar1 != 0) {
          iVar1 = strcmp(v,"grep");
          if (iVar1 != 0) {
            iVar1 = strcmp(v,"egrep");
            bVar2 = iVar1 == 0;
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool verifyGrammar(char const * v)
    {
        return (strcmp(v, "ECMAScript") == 0 ||
                strcmp(v, "basic") == 0 ||
                strcmp(v, "extended") == 0 ||
                strcmp(v, "awk") == 0 ||
                strcmp(v, "grep") == 0 ||
                strcmp(v, "egrep") == 0);
    }